

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall SQClass::Finalize(SQClass *this)

{
  SQUnsignedInteger SVar1;
  SQUnsignedInteger SVar2;
  SQClassMember *this_00;
  long local_50;
  SQInteger _n__1;
  SQClassMember local_38;
  SQUnsignedInteger local_18;
  SQInteger _n_;
  SQClass *this_local;
  
  _n_ = (SQInteger)this;
  ::SQObjectPtr::Null(&this->_attributes);
  for (local_18 = 0; SVar1 = local_18, SVar2 = sqvector<SQClassMember>::size(&this->_defaultvalues),
      (long)SVar1 < (long)SVar2; local_18 = local_18 + 1) {
    this_00 = sqvector<SQClassMember>::operator[](&this->_defaultvalues,local_18);
    SQClassMember::Null(this_00);
  }
  local_38.attrs.super_SQObject._type = 0;
  local_38.attrs.super_SQObject._4_4_ = 0;
  local_38.attrs.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_38.val.super_SQObject._type = 0;
  local_38.val.super_SQObject._4_4_ = 0;
  local_38.val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SQClassMember::SQClassMember(&local_38);
  sqvector<SQClassMember>::resize(&this->_methods,0,&local_38);
  SQClassMember::~SQClassMember(&local_38);
  for (local_50 = 0; local_50 < 0x12; local_50 = local_50 + 1) {
    ::SQObjectPtr::Null(this->_metamethods + local_50);
  }
  if (this->_members != (SQTable *)0x0) {
    (this->_members->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef =
         (this->_members->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef - 1;
    if ((this->_members->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef == 0) {
      (*(this->_members->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
        _vptr_SQRefCounted[2])();
    }
    this->_members = (SQTable *)0x0;
  }
  if ((this->_base != (SQClass *)0x0) && (this->_base != (SQClass *)0x0)) {
    (this->_base->super_SQCollectable).super_SQRefCounted._uiRef =
         (this->_base->super_SQCollectable).super_SQRefCounted._uiRef - 1;
    if ((this->_base->super_SQCollectable).super_SQRefCounted._uiRef == 0) {
      (*(this->_base->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    this->_base = (SQClass *)0x0;
  }
  return;
}

Assistant:

void SQClass::Finalize() {
    _attributes.Null();
    _NULL_SQOBJECT_VECTOR(_defaultvalues,_defaultvalues.size());
    _methods.resize(0);
    _NULL_SQOBJECT_VECTOR(_metamethods,MT_LAST);
    __ObjRelease(_members);
    if(_base) {
        __ObjRelease(_base);
    }
}